

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempLivnessFiller.cpp
# Opt level: O0

int processCodeLine(CodeLine *codeLine)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  element_type *peVar4;
  reference ppCVar5;
  reference pbVar6;
  reference pCVar7;
  _Self local_218;
  _Self local_210;
  CTemp local_208;
  undefined1 local_1e8 [8];
  CTemp outTemp;
  __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_> local_1c0;
  iterator __end2_1;
  iterator __begin2_1;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__range2_1;
  string local_188 [7];
  bool found;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> liveOutTemp;
  _Self local_168;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  _Self local_140;
  _Self local_138;
  CodeLine *local_130;
  CodeLine *prevLine;
  iterator __end2;
  iterator __begin2;
  vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> liveInTemp;
  _Self local_f0;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  CTemp local_c8;
  _Self local_a8;
  CTemp local_a0;
  _Self local_80 [3];
  undefined1 local_68 [8];
  CTemp useTemp;
  iterator __end1;
  iterator __begin1;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__range1;
  int changesCount;
  CodeLine *codeLine_local;
  
  __range1._4_4_ = 0;
  peVar4 = std::
           __shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)codeLine);
  (**peVar4->_vptr_AssemblyCommand)(&__begin1);
  __end1 = std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::begin
                     ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin1);
  useTemp._24_8_ =
       std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::end
                 ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
                                     *)&useTemp.field_0x18), bVar1) {
    pCVar7 = __gnu_cxx::
             __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
             ::operator*(&__end1);
    IRT::CTemp::CTemp((CTemp *)local_68,pCVar7);
    IRT::CTemp::ToString_abi_cxx11_(&local_a0);
    local_80[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&codeLine->liveInTemps,&local_a0.name);
    local_a8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&codeLine->liveInTemps);
    bVar1 = std::operator==(local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar1) {
      __range1._4_4_ = __range1._4_4_ + 1;
      IRT::CTemp::ToString_abi_cxx11_(&local_c8);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&codeLine->liveInTemps,&local_c8.name);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    IRT::CTemp::~CTemp((CTemp *)local_68);
    __gnu_cxx::
    __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>::
    operator++(&__end1);
  }
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector
            ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin1);
  __end1_1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&codeLine->liveInTemps);
  local_f0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&codeLine->liveInTemps);
  while (bVar1 = std::operator!=(&__end1_1,&local_f0), bVar1) {
    pbVar6 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1_1);
    std::__cxx11::string::string((string *)&__range2,(string *)pbVar6);
    __end2 = std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::begin
                       (&codeLine->prevLines);
    prevLine = (CodeLine *)
               std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::end
                         (&codeLine->prevLines);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<AssemblyCode::CodeLine_**,_std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>_>
                                       *)&prevLine), bVar1) {
      ppCVar5 = __gnu_cxx::
                __normal_iterator<AssemblyCode::CodeLine_**,_std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>_>
                ::operator*(&__end2);
      local_130 = *ppCVar5;
      local_138._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_130->liveOutTemps,(key_type *)&__range2);
      local_140._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&local_130->liveOutTemps);
      bVar1 = std::operator==(&local_138,&local_140);
      if (bVar1) {
        __range1._4_4_ = __range1._4_4_ + 1;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&local_130->liveOutTemps,(value_type *)&__range2);
      }
      __gnu_cxx::
      __normal_iterator<AssemblyCode::CodeLine_**,_std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)&__range2);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&codeLine->liveOutTemps);
  local_168._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&codeLine->liveOutTemps);
  do {
    bVar1 = std::operator!=(&__end1_2,&local_168);
    if (!bVar1) {
      return __range1._4_4_;
    }
    pbVar6 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1_2);
    std::__cxx11::string::string(local_188,(string *)pbVar6);
    bVar1 = false;
    peVar4 = std::
             __shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)codeLine);
    (*peVar4->_vptr_AssemblyCommand[1])(&__begin2_1);
    __end2_1 = std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::begin
                         ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin2_1);
    local_1c0._M_current =
         (CTemp *)std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::end
                            ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin2_1);
    while (bVar2 = __gnu_cxx::operator!=(&__end2_1,&local_1c0), bVar2) {
      pCVar7 = __gnu_cxx::
               __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
               ::operator*(&__end2_1);
      IRT::CTemp::CTemp((CTemp *)local_1e8,pCVar7);
      IRT::CTemp::ToString_abi_cxx11_(&local_208);
      _Var3 = std::operator==(&local_208.name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_188);
      std::__cxx11::string::~string((string *)&local_208);
      if (_Var3) {
        bVar1 = true;
        outTemp._28_4_ = 10;
      }
      else {
        outTemp._28_4_ = 0;
      }
      IRT::CTemp::~CTemp((CTemp *)local_1e8);
      if (outTemp._28_4_ != 0) goto LAB_001c01d8;
      __gnu_cxx::
      __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>::
      operator++(&__end2_1);
    }
    outTemp._28_4_ = 10;
LAB_001c01d8:
    std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector
              ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin2_1);
    if (!bVar1) {
      local_210._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&codeLine->liveInTemps,(key_type *)local_188);
      local_218._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&codeLine->liveInTemps);
      bVar1 = std::operator==(&local_210,&local_218);
      if (bVar1) {
        __range1._4_4_ = __range1._4_4_ + 1;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&codeLine->liveInTemps,(value_type *)local_188);
      }
    }
    std::__cxx11::string::~string(local_188);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_2);
  } while( true );
}

Assistant:

int processCodeLine(AssemblyCode::CodeLine* codeLine) {
    int changesCount = 0;

    for (auto useTemp : codeLine->command->GetIn()) {
        if (codeLine->liveInTemps.find(useTemp.ToString()) == codeLine->liveInTemps.end()) {
            changesCount += 1;
            codeLine->liveInTemps.insert(useTemp.ToString());
        }
    }

    for (auto liveInTemp : codeLine->liveInTemps) {
        for (auto prevLine : codeLine->prevLines) {
            if (prevLine->liveOutTemps.find(liveInTemp) == prevLine->liveOutTemps.end()) {
                changesCount += 1;
                prevLine->liveOutTemps.insert(liveInTemp);
            }
        }
    }

    for (auto liveOutTemp : codeLine->liveOutTemps) {
        bool found = false;
        for (auto outTemp : codeLine->command->GetOut()) {
            if (outTemp.ToString() == liveOutTemp) {
                found = true;
                break;
            }
        }

        if (!found) {
            if (codeLine->liveInTemps.find(liveOutTemp) == codeLine->liveInTemps.end()) {
                changesCount += 1;
                codeLine->liveInTemps.insert(liveOutTemp);
            }
        }
    }

    return changesCount;
}